

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O3

Vec_Int_t * Llb_Nonlin4CreateOrderSimple(Aig_Man_t *pAig)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int *__s;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  
  iVar1 = pAig->vObjs->nSize;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  pVVar7->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar7->pArray = (int *)0x0;
    pVVar7->nSize = iVar1;
  }
  else {
    __s = (int *)malloc((long)iVar6 << 2);
    pVVar7->pArray = __s;
    pVVar7->nSize = iVar1;
    if (__s != (int *)0x0) {
      memset(__s,0xff,(long)iVar1 << 2);
      goto LAB_00834782;
    }
  }
  __s = (int *)0x0;
LAB_00834782:
  pVVar4 = pAig->vCis;
  if (pVVar4->nSize < 1) {
    lVar8 = 0;
  }
  else {
    ppvVar5 = pVVar4->pArray;
    lVar9 = 0;
    do {
      iVar6 = *(int *)((long)ppvVar5[lVar9] + 0x24);
      if (((long)iVar6 < 0) || (iVar1 <= iVar6)) goto LAB_00834812;
      lVar8 = lVar9 + 1;
      __s[iVar6] = (int)lVar9;
      lVar9 = lVar8;
    } while (lVar8 < pVVar4->nSize);
  }
  iVar6 = pAig->nRegs;
  if (0 < iVar6) {
    pVVar4 = pAig->vCos;
    iVar2 = pAig->nTruePos;
    iVar10 = 0;
    do {
      uVar11 = iVar2 + iVar10;
      if (((int)uVar11 < 0) || (pVVar4->nSize <= (int)uVar11)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar3 = *(int *)((long)pVVar4->pArray[uVar11] + 0x24);
      if (((long)iVar3 < 0) || (iVar1 <= iVar3)) {
LAB_00834812:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __s[iVar3] = (int)lVar8 + iVar10;
      iVar10 = iVar10 + 1;
    } while (iVar10 < iVar6);
  }
  return pVVar7;
}

Assistant:

Vec_Int_t * Llb_Nonlin4CreateOrderSimple( Aig_Man_t * pAig )
{
    Vec_Int_t * vOrder;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    vOrder = Vec_IntStartFull( Aig_ManObjNumMax(pAig) );
    Aig_ManForEachCi( pAig, pObj, i )
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
    Saig_ManForEachLi( pAig, pObj, i )
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
    return vOrder;
}